

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase270::run(TestCase270 *this)

{
  Builder builder;
  PipeWithSmallBuffer fds;
  IndexingIterator<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder,_capnproto_test::capnp::test::TestAllTypes::Builder>
  local_210;
  Own<kj::AsyncOutputStream,_std::nullptr_t> output;
  Own<kj::Function<void_()>::Iface,_std::nullptr_t> local_1d8;
  Thread thread;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  AsyncIoContext ioContext;
  Builder list;
  Builder root;
  TestMessageBuilder message;
  
  PipeWithSmallBuffer::PipeWithSmallBuffer(&fds);
  kj::setupAsyncIo();
  (*(ioContext.lowLevelProvider.ptr)->_vptr_LowLevelAsyncIoProvider[1])
            (&output,ioContext.lowLevelProvider.ptr,(ulong)(uint)fds.fds[1],0);
  TestMessageBuilder::TestMessageBuilder(&message,1);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,(MessageBuilder *)&message);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructList(&list,&root,0x10);
  local_210.container = &list;
  for (local_210.index = 0; local_210.index != list.builder.elementCount;
      local_210.index = local_210.index + 1) {
    IndexingIterator<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder,_capnproto_test::capnp::test::TestAllTypes::Builder>
    ::operator*((Builder *)&thread,&local_210);
    builder._builder.capTable = (CapTableBuilder *)thread.threadId;
    builder._builder.segment = (SegmentBuilder *)thread.state;
    builder._builder.data = (void *)thread._16_8_;
    builder._builder.pointers = (WirePointer *)uStack_1b0;
    builder._builder._32_8_ = local_1a8;
    initTestMessage(builder);
  }
  local_1d8.ptr = (Iface *)operator_new(0x18);
  (local_1d8.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0064f3f8;
  local_1d8.ptr[1]._vptr_Iface = (_func_int **)&fds;
  local_1d8.ptr[2]._vptr_Iface = (_func_int **)&list;
  local_1d8.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<void()>::Impl<capnp::_::(anonymous_namespace)::TestCase270::run()::$_0>>
        ::instance;
  kj::Thread::Thread(&thread,(Function<void_()> *)&local_1d8);
  kj::Own<kj::Function<void_()>::Iface,_std::nullptr_t>::dispose(&local_1d8);
  writeMessage((capnp *)&local_210,output.ptr,(MessageBuilder *)&message);
  kj::Promise<void>::wait((Promise<void> *)&local_210,ioContext.waitScope);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_210);
  kj::Thread::~Thread(&thread);
  TestMessageBuilder::~TestMessageBuilder(&message);
  kj::Own<kj::AsyncOutputStream,_std::nullptr_t>::dispose(&output);
  kj::AsyncIoContext::~AsyncIoContext(&ioContext);
  PipeWithSmallBuffer::~PipeWithSmallBuffer(&fds);
  return;
}

Assistant:

TEST(SerializeAsyncTest, WriteAsync) {
  PipeWithSmallBuffer fds;
  auto ioContext = kj::setupAsyncIo();
  auto output = ioContext.lowLevelProvider->wrapOutputFd(fds[1]);

  TestMessageBuilder message(1);
  auto root = message.getRoot<TestAllTypes>();
  auto list = root.initStructList(16);
  for (auto element: list) {
    initTestMessage(element);
  }

  kj::Thread thread([&]() {
    SocketInputStream input(fds[0]);
    InputStreamMessageReader reader(input);
    auto listReader = reader.getRoot<TestAllTypes>().getStructList();
    EXPECT_EQ(list.size(), listReader.size());
    for (auto element: listReader) {
      checkTestMessage(element);
    }
  });

  writeMessage(*output, message).wait(ioContext.waitScope);
}